

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

void __thiscall
dg::DOD::computeDOD(DOD *this,ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,bool asTernary)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  int iVar4;
  CDNode *start;
  _Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_> start_00;
  long lVar5;
  _Head_base<0UL,_dg::CDNode_*,_false> start_01;
  pair<dg::CDNode_*,_dg::CDNode_*> pVar6;
  pair<dg::CDNode_*,_dg::CDNode_*> pVar7;
  pair<dg::CDNode_*,_dg::CDNode_*> pVar8;
  anon_class_8_1_ba1cbf32 isred;
  anon_class_8_1_ba1cbf32 isblue;
  
  iVar4 = -1;
  p_Var1 = *(_Base_ptr *)
            ((long)&(CAp->blues)._bits.
                    super_map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  if (((CAp->blues)._bits.
       super_map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var2 = p_Var1[1]._M_parent, ((ulong)p_Var2 & 1) == 0)) {
    lVar3 = 0;
    do {
      lVar5 = lVar3;
      if (lVar5 == 0x3f) break;
      lVar3 = lVar5 + 1;
    } while (((ulong)p_Var2 >> ((byte)lVar5 & 0x3f) & 2) == 0);
    iVar4 = (int)lVar5;
  }
  start_01._M_head_impl =
       *(CDNode **)
        &(CAp->Ap)._nodes.
         super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar4 + p_Var1[1]._M_color]._M_t.
         super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t;
  isred.CAp = CAp;
  isblue.CAp = CAp;
  pVar6 = find<dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_1_,dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_2_>
                    (this,start_01._M_head_impl,start_01._M_head_impl,&isblue,&isred);
  start = pVar6.second;
  pVar7 = find<dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_2_,dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_1_>
                    (this,start,start_01._M_head_impl,&isred,&isblue);
  start_00.super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl =
       (_Head_base<0UL,_dg::CDNode_*,_false>)pVar7.second;
  if ((start_00.super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl == (CDNode *)0x0) ||
     (pVar8 = find<dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_2_,dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_2_>
                        (this,(CDNode *)
                              start_00.super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl,
                         start_01._M_head_impl,&isred,&isred),
     start_01._M_head_impl =
          (CDNode *)start_00.super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl,
     pVar8.first == (CDNode *)0x0)) {
    if (asTernary) {
      constructTernaryRelation(CAp,p,CD,revCD,pVar6.first,start_01._M_head_impl,start,pVar7.first);
    }
    else {
      constructBinaryRelation(CAp,p,CD,revCD,pVar6.first,start_01._M_head_impl,start,pVar7.first);
    }
  }
  return;
}

Assistant:

void computeDOD(ColoredAp &CAp, CDNode *p, ResultT &CD, ResultT &revCD,
                    bool asTernary = false) {
        assert(checkAp(CAp.Ap)); // sanity check

        CDNode *b1 = nullptr, *b2 = nullptr, *b3 = nullptr;
        CDNode *r1 = nullptr, *r2 = nullptr;

        // get some blue node to have a starting point
        auto bid = *(CAp.blues.begin());
        // DBG(tmp, "Blue node with id " << bid);
        b1 = CAp.Ap.getNode(bid);
        assert(b1 && "The blue node is not on Ap");
        // DBG(tmp, "Starting from blue: " << b1->getID());
        assert(CAp.isBlue(b1));

        auto isblue = [&](CDNode *x) -> bool { return CAp.isBlue(x); };
        auto isred = [&](CDNode *x) -> bool { return CAp.isRed(x); };

        std::tie(b2, r1) = find(b1, b1, isblue, isred);
        std::tie(r2, b3) = find(r1, b1, isred, isblue);
        if (b3 != nullptr) {
            if (find(b3, b1, isred, isred).first != nullptr) {
                // there is another red, no DOD
                return;
            }
        } else {
            b3 = b1;
        }

        assert(b1);
        assert(b2);
        assert(b3);
        assert(r1);
        assert(r2);

        if (asTernary) {
            constructTernaryRelation(CAp, p, CD, revCD, b2, b3, r1, r2);
        } else { // break into binary relation
            constructBinaryRelation(CAp, p, CD, revCD, b2, b3, r1, r2);
        }
    }